

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_metadata.cpp
# Opt level: O3

unsafe_unique_array<char> __thiscall
duckdb::ArrowSchemaMetadata::SerializeMetadata(ArrowSchemaMetadata *this)

{
  void *__dest;
  undefined8 *puVar1;
  undefined8 *puVar2;
  size_t __n;
  size_t __n_00;
  __buckets_ptr __s;
  long in_RSI;
  ulong __n_01;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  
  __n_01 = 4;
  puVar1 = *(undefined8 **)(in_RSI + 0x10);
  for (puVar2 = puVar1; puVar2 != (undefined8 *)0x0; puVar2 = (undefined8 *)*puVar2) {
    __n_01 = __n_01 + puVar2[2] + puVar2[6] + 8;
  }
  __s = (__buckets_ptr)operator_new__(__n_01);
  switchD_012e3010::default(__s,0,__n_01);
  (this->schema_metadata_map)._M_h._M_buckets = __s;
  *(undefined4 *)__s = *(undefined4 *)(in_RSI + 0x18);
  for (; puVar1 != (undefined8 *)0x0; puVar1 = (undefined8 *)*puVar1) {
    __n = puVar1[2];
    *(undefined4 *)((long)__s + 4) = (int)__n;
    switchD_012b9b0d::default(__s + 1,(void *)puVar1[1],__n);
    __n_00 = puVar1[6];
    __dest = (void *)((long)__s + __n + 0xc);
    *(int *)((long)__dest + -4) = (int)__n_00;
    switchD_012b9b0d::default(__dest,(void *)puVar1[5],__n_00);
    __s = (__buckets_ptr)((long)__s + 4 + __n_00 + __n + 4);
  }
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)this;
}

Assistant:

unsafe_unique_array<char> ArrowSchemaMetadata::SerializeMetadata() const {
	// First we have to figure out the total size:
	// 1. number of key-value pairs (int32)
	idx_t total_size = sizeof(int32_t);
	for (const auto &option : schema_metadata_map) {
		// 2. Length of the key and value (2 * int32)
		total_size += 2 * sizeof(int32_t);
		// 3. Length of key
		total_size += option.first.size();
		// 4. Length of value
		total_size += option.second.size();
	}
	auto metadata_array_ptr = make_unsafe_uniq_array<char>(total_size);
	auto metadata_ptr = metadata_array_ptr.get();
	// 1. number of key-value pairs (int32)
	const idx_t map_size = schema_metadata_map.size();
	memcpy(metadata_ptr, &map_size, sizeof(int32_t));
	metadata_ptr += sizeof(int32_t);
	// Iterate through each key-value pair in the map
	for (const auto &pair : schema_metadata_map) {
		const std::string &key = pair.first;
		idx_t key_size = key.size();
		// Length of the key (int32)
		memcpy(metadata_ptr, &key_size, sizeof(int32_t));
		metadata_ptr += sizeof(int32_t);
		// Key
		memcpy(metadata_ptr, key.c_str(), key_size);
		metadata_ptr += key_size;
		const std::string &value = pair.second;
		const idx_t value_size = value.size();
		// Length of the value (int32)
		memcpy(metadata_ptr, &value_size, sizeof(int32_t));
		metadata_ptr += sizeof(int32_t);
		// Value
		memcpy(metadata_ptr, value.c_str(), value_size);
		metadata_ptr += value_size;
	}
	return metadata_array_ptr;
}